

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_fwd.hpp
# Opt level: O0

void __thiscall toml::detail::maybe::maybe(maybe *this,maybe *param_2)

{
  scanner_base *in_RSI;
  scanner_base *in_RDI;
  scanner_storage *unaff_retaddr;
  scanner_base *other;
  
  other = in_RDI;
  scanner_base::scanner_base(in_RDI,in_RSI);
  in_RDI->_vptr_scanner_base = (_func_int **)&PTR__maybe_0091bb98;
  scanner_storage::scanner_storage(unaff_retaddr,(scanner_storage *)other);
  return;
}

Assistant:

maybe(const maybe&)            = default;